

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O2

void __thiscall
QOpenGLProgramBinarySupportCheck::QOpenGLProgramBinarySupportCheck
          (QOpenGLProgramBinarySupportCheck *this,QOpenGLContext *context)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  QOpenGLContextGroup *group;
  QOpenGLContext *this_00;
  QOpenGLFunctions *pQVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  GLint fmtCount;
  QArrayDataPointer<char> local_50;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  group = QOpenGLContext::shareGroup(context);
  QOpenGLSharedResource::QOpenGLSharedResource(&this->super_QOpenGLSharedResource,group);
  (this->super_QOpenGLSharedResource)._vptr_QOpenGLSharedResource =
       (_func_int **)&PTR__QOpenGLSharedResourceGuard_00787fc0;
  this->m_supported = false;
  cVar1 = QCoreApplication::testAttribute(AA_DisableShaderDiskCache);
  if (cVar1 == '\0') {
    iVar3 = qEnvironmentVariableIntValue("QT_DISABLE_SHADER_DISK_CACHE",(bool *)0x0);
    if (iVar3 == 0) {
      this_00 = QOpenGLContext::currentContext();
      if (this_00 != (QOpenGLContext *)0x0) {
        bVar2 = QOpenGLContext::isOpenGLES(this_00);
        if (bVar2) {
          QtPrivateLogging::lcOpenGLProgramDiskCache();
          if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug
                     ._q_value._M_base._M_i & 1) != 0) {
            local_50.d._0_4_ = 2;
            local_50._4_8_ = 0;
            local_50._12_8_ = 0;
            local_50.size._4_4_ = 0;
            local_38 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
            QOpenGLContext::format((QOpenGLContext *)&fmtCount);
            uVar4 = QSurfaceFormat::majorVersion((QSurfaceFormat *)&fmtCount);
            QMessageLogger::debug((char *)&local_50,"OpenGL ES v%d context",(ulong)uVar4);
            QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&fmtCount);
          }
          QOpenGLContext::format((QOpenGLContext *)&local_50);
          iVar3 = QSurfaceFormat::majorVersion((QSurfaceFormat *)&local_50);
          QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_50);
          if (iVar3 < 3) {
            QByteArray::QByteArray((QByteArray *)&local_50,"GL_OES_get_program_binary",-1);
            bVar2 = QOpenGLContext::hasExtension(this_00,(QByteArray *)&local_50);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
            QtPrivateLogging::lcOpenGLProgramDiskCache();
            if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.
                       enabledDebug._q_value._M_base._M_i & 1) != 0) {
              pcVar6 = "GL_OES_get_program_binary support = %d";
              goto LAB_004da4e8;
            }
            goto LAB_004da4ef;
          }
LAB_004da4f4:
          this->m_supported = true;
        }
        else {
          QByteArray::QByteArray((QByteArray *)&local_50,"GL_ARB_get_program_binary",-1);
          bVar2 = QOpenGLContext::hasExtension(this_00,(QByteArray *)&local_50);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
          QtPrivateLogging::lcOpenGLProgramDiskCache();
          if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug
                     ._q_value._M_base._M_i & 1) != 0) {
            pcVar6 = "GL_ARB_get_program_binary support = %d";
LAB_004da4e8:
            local_50.size._4_4_ = 0;
            local_50._12_8_ = 0;
            local_50._4_8_ = 0;
            local_50.d._0_4_ = 2;
            local_38 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
            QMessageLogger::debug((char *)&local_50,pcVar6,(ulong)bVar2);
          }
LAB_004da4ef:
          if (bVar2 != false) goto LAB_004da4f4;
        }
        if (this->m_supported == true) {
          fmtCount = 0;
          pQVar5 = QOpenGLContext::functions(this_00);
          (*(pQVar5->d_ptr->field_0).functions[0x19])(0x87fe,&fmtCount);
          QtPrivateLogging::lcOpenGLProgramDiskCache();
          if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug
                     ._q_value._M_base._M_i & 1) != 0) {
            local_50.d._0_4_ = 2;
            local_50.size._4_4_ = 0;
            local_50._4_8_ = 0;
            local_50._12_8_ = 0;
            local_38 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
            QMessageLogger::debug
                      ((char *)&local_50,"Supported binary format count = %d",(ulong)(uint)fmtCount)
            ;
          }
          this->m_supported = 0 < fmtCount;
        }
      }
      QtPrivateLogging::lcOpenGLProgramDiskCache();
      if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
                 _q_value._M_base._M_i & 1) != 0) {
        local_50.d._0_4_ = 2;
        local_50.size._4_4_ = 0;
        local_50._4_8_ = 0;
        local_50._12_8_ = 0;
        local_38 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
        QMessageLogger::debug
                  ((char *)&local_50,"Shader cache supported = %d",(ulong)this->m_supported);
      }
      goto LAB_004da343;
    }
    QtPrivateLogging::lcOpenGLProgramDiskCache();
    if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
               _q_value._M_base._M_i & 1) == 0) goto LAB_004da343;
    pcVar6 = "Shader cache disabled via env var";
  }
  else {
    QtPrivateLogging::lcOpenGLProgramDiskCache();
    if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
               _q_value._M_base._M_i & 1) == 0) goto LAB_004da343;
    pcVar6 = "Shader cache disabled via app attribute";
  }
  local_50.size._4_4_ = 0;
  local_50._12_8_ = 0;
  local_50._4_8_ = 0;
  local_50.d._0_4_ = 2;
  local_38 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
  QMessageLogger::debug((char *)&local_50,pcVar6);
LAB_004da343:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QOpenGLProgramBinarySupportCheck::QOpenGLProgramBinarySupportCheck(QOpenGLContext *context)
    : QOpenGLSharedResource(context->shareGroup()),
      m_supported(false)
{
    if (QCoreApplication::testAttribute(Qt::AA_DisableShaderDiskCache)) {
        qCDebug(lcOpenGLProgramDiskCache, "Shader cache disabled via app attribute");
        return;
    }
    if (qEnvironmentVariableIntValue("QT_DISABLE_SHADER_DISK_CACHE")) {
        qCDebug(lcOpenGLProgramDiskCache, "Shader cache disabled via env var");
        return;
    }

    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    if (ctx) {
        if (ctx->isOpenGLES()) {
            qCDebug(lcOpenGLProgramDiskCache, "OpenGL ES v%d context", ctx->format().majorVersion());
            if (ctx->format().majorVersion() >= 3) {
                m_supported = true;
            } else {
                const bool hasExt = ctx->hasExtension("GL_OES_get_program_binary");
                qCDebug(lcOpenGLProgramDiskCache, "GL_OES_get_program_binary support = %d", hasExt);
                if (hasExt)
                    m_supported = true;
            }
        } else {
            const bool hasExt = ctx->hasExtension("GL_ARB_get_program_binary");
            qCDebug(lcOpenGLProgramDiskCache, "GL_ARB_get_program_binary support = %d", hasExt);
            if (hasExt)
                m_supported = true;
        }
        if (m_supported) {
            GLint fmtCount = 0;
            ctx->functions()->glGetIntegerv(GL_NUM_PROGRAM_BINARY_FORMATS, &fmtCount);
            qCDebug(lcOpenGLProgramDiskCache, "Supported binary format count = %d", fmtCount);
            m_supported = fmtCount > 0;
        }
    }
    qCDebug(lcOpenGLProgramDiskCache, "Shader cache supported = %d", m_supported);
}